

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtextdocumentlayout.cpp
# Opt level: O3

void __thiscall
QTextDocumentLayoutPrivate::drawBlock
          (QTextDocumentLayoutPrivate *this,QPointF *offset,QPainter *painter,PaintContext *context,
          QTextBlock *bl,bool inRootFrame)

{
  QTextCursor *this_00;
  double dVar1;
  Selection *pSVar2;
  QTextDocument *this_01;
  _Head_base<0UL,_QBrushData_*,_false> _Var3;
  qreal qVar4;
  qreal qVar5;
  Data *this_02;
  undefined8 uVar6;
  bool bVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  Type TVar12;
  QTextLayout *this_03;
  QTextFrame *pQVar13;
  QTextFrameLayoutData *data;
  long lVar14;
  QTextCharFormat *selectionFormat;
  QTextObject *pQVar15;
  QPen *p;
  QBrush *pQVar16;
  QMetaType QVar17;
  int iVar18;
  QVariant *__return_storage_ptr__;
  ulong uVar19;
  int iVar20;
  QTextFormat *pQVar21;
  QTextCharFormat *pQVar22;
  long in_FS_OFFSET;
  double dVar23;
  char *pcVar24;
  QByteArrayView QVar25;
  QByteArrayView QVar26;
  QByteArrayView QVar27;
  QTextLine QVar28;
  QPointF QVar29;
  QSizeF QVar30;
  QTextLength QVar31;
  QPen oldPen;
  QBrush bg;
  QPen local_110;
  QBrush local_108;
  undefined1 local_100 [8];
  QRectF local_f8;
  undefined1 local_d0 [16];
  QDebug local_c0;
  undefined1 local_b8 [12];
  undefined4 uStack_ac;
  qint32 local_a8;
  undefined4 uStack_a4;
  undefined4 uStack_a0;
  undefined4 uStack_9c;
  _Head_base<0UL,_QBrushData_*,_false> local_98;
  QMetaType local_90;
  QString local_88;
  undefined1 local_68 [16];
  undefined1 local_58 [24];
  char *pcStack_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  this_03 = QTextBlock::layout(bl);
  local_a8 = -1;
  uStack_a4 = 0xffffffff;
  uStack_a0 = 0xffffffff;
  uStack_9c = 0xffffffff;
  local_b8._8_4_ = 0xffffffff;
  local_b8._0_8_ = 0xffffffffffffffff;
  uStack_ac = 0xffffffff;
  QTextLayout::boundingRect((QRectF *)local_b8,this_03);
  QVar29 = QTextLayout::position(this_03);
  dVar23 = QVar29.yp + offset->yp + (double)stack0xffffffffffffff50;
  local_b8._8_4_ = SUB84(dVar23,0);
  local_b8._0_8_ = QVar29.xp + offset->xp + (double)local_b8._0_8_;
  uStack_ac = (int)((ulong)dVar23 >> 0x20);
  bVar7 = QTextBlock::isVisible(bl);
  local_58._0_8_ = (QTextFormatPrivate *)CONCAT44(local_58._4_4_,local_58._0_4_);
  local_58._16_8_ = (QTextFrame *)CONCAT44(local_58._20_4_,local_58._16_4_);
  if (!bVar7) goto LAB_004e6bbf;
  if ((0.0 < (context->clip).w) && (dVar23 = (context->clip).h, 0.0 < dVar23)) {
    dVar1 = (context->clip).yp;
    local_58._0_8_ = (QTextFormatPrivate *)CONCAT44(local_58._4_4_,local_58._0_4_);
    local_58._16_8_ = (QTextFrame *)CONCAT44(local_58._20_4_,local_58._16_4_);
    if (((double)CONCAT44(uStack_9c,uStack_a0) + (double)stack0xffffffffffffff50 < dVar1) ||
       (local_58._0_8_ = (QTextFormatPrivate *)CONCAT44(local_58._4_4_,local_58._0_4_),
       local_58._16_8_ = (QTextFrame *)CONCAT44(local_58._20_4_,local_58._16_4_),
       dVar23 + dVar1 < (double)stack0xffffffffffffff50)) goto LAB_004e6bbf;
  }
  lcDraw();
  if (((byte)lcDraw::category.field_2.bools.enabledDebug._q_value._M_base._M_i & 1) != 0) {
    local_58._0_4_ = 2;
    local_58._4_4_ = 0;
    local_58._8_4_ = 0;
    local_58._12_4_ = 0;
    local_58._16_4_ = 0;
    local_58._20_4_ = 0;
    pcStack_40 = lcDraw::category.name;
    QMessageLogger::debug();
    uVar6 = local_68._0_8_;
    QVar25.m_data = (storage_type *)0x9;
    QVar25.m_size = (qsizetype)&local_f8;
    QString::fromUtf8(QVar25);
    QTextStream::operator<<((QTextStream *)uVar6,(QString *)&local_f8);
    if ((QArrayData *)local_f8.xp != (QArrayData *)0x0) {
      LOCK();
      (((QBasicAtomicInt *)local_f8.xp)->_q_value).super___atomic_base<int>._M_i =
           (((QBasicAtomicInt *)local_f8.xp)->_q_value).super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((((QBasicAtomicInt *)local_f8.xp)->_q_value).super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate((QArrayData *)local_f8.xp,2,0x10);
      }
    }
    if (*(QTextStream *)(local_68._0_8_ + 0x30) == (QTextStream)0x1) {
      QTextStream::operator<<((QTextStream *)local_68._0_8_,' ');
    }
    iVar8 = QTextBlock::position(bl);
    QTextStream::operator<<((QTextStream *)local_68._0_8_,iVar8);
    if (*(QTextStream *)(local_68._0_8_ + 0x30) == (QTextStream)0x1) {
      QTextStream::operator<<((QTextStream *)local_68._0_8_,' ');
    }
    uVar6 = local_68._0_8_;
    QVar26.m_data = (storage_type *)0x2;
    QVar26.m_size = (qsizetype)&local_f8;
    QString::fromUtf8(QVar26);
    QTextStream::operator<<((QTextStream *)uVar6,(QString *)&local_f8);
    if ((QArrayData *)local_f8.xp != (QArrayData *)0x0) {
      LOCK();
      (((QBasicAtomicInt *)local_f8.xp)->_q_value).super___atomic_base<int>._M_i =
           (((QBasicAtomicInt *)local_f8.xp)->_q_value).super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((((QBasicAtomicInt *)local_f8.xp)->_q_value).super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate((QArrayData *)local_f8.xp,2,0x10);
      }
    }
    if (*(QTextStream *)(local_68._0_8_ + 0x30) == (QTextStream)0x1) {
      QTextStream::operator<<((QTextStream *)local_68._0_8_,' ');
    }
    *(int *)&((QTextFormatPrivate *)local_68._0_8_)->hashValue =
         (int)((QTextFormatPrivate *)local_68._0_8_)->hashValue + 1;
    ::operator<<((QDebug *)&local_88,(QPointF *)local_d0);
    this_02 = local_88.d.d;
    QVar27.m_data = (storage_type *)0x2;
    QVar27.m_size = (qsizetype)&local_f8;
    QString::fromUtf8(QVar27);
    QTextStream::operator<<((QTextStream *)this_02,(QString *)&local_f8);
    if ((QArrayData *)local_f8.xp != (QArrayData *)0x0) {
      LOCK();
      (((QBasicAtomicInt *)local_f8.xp)->_q_value).super___atomic_base<int>._M_i =
           (((QBasicAtomicInt *)local_f8.xp)->_q_value).super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((((QBasicAtomicInt *)local_f8.xp)->_q_value).super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate((QArrayData *)local_f8.xp,2,0x10);
      }
    }
    if ((char)(((QArrayData *)((long)local_88.d.d + 0x30))->ref_)._q_value.super___atomic_base<int>.
              _M_i == '\x01') {
      QTextStream::operator<<((QTextStream *)local_88.d.d,' ');
    }
    local_d0._8_8_ = local_88.d.d;
    *(int *)((long)local_88.d.d + 0x28) = *(int *)((long)local_88.d.d + 0x28) + 1;
    QTextLayout::boundingRect(&local_f8,this_03);
    ::operator<<((QDebug *)&local_c0,(QRectF *)(local_d0 + 8));
    QDebug::~QDebug(&local_c0);
    QDebug::~QDebug((QDebug *)(local_d0 + 8));
    QDebug::~QDebug((QDebug *)&local_88);
    QDebug::~QDebug((QDebug *)local_d0);
    QDebug::~QDebug((QDebug *)local_68);
  }
  local_68._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_68._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  QTextBlock::blockFormat((QTextBlock *)local_68);
  local_100 = (undefined1  [8])&DAT_aaaaaaaaaaaaaaaa;
  QTextFormat::brushProperty((QTextFormat *)local_100,(int)(QTextBlock *)local_68);
  bVar7 = QBrush::doCompareEqualStyle((QBrush *)local_100,NoBrush);
  if (!bVar7) {
    pcStack_40 = (char *)CONCAT44(uStack_9c,uStack_a0);
    local_58._16_4_ = local_a8;
    local_58._20_4_ = uStack_a4;
    pQVar13 = (QTextFrame *)CONCAT44(uStack_a4,local_a8);
    local_58._0_4_ = local_b8._0_4_;
    local_58._4_4_ = local_b8._4_4_;
    local_58._8_4_ = local_b8._8_4_;
    local_58._12_4_ = local_b8._12_4_;
    if (inRootFrame) {
      QVar30 = QTextDocument::pageSize((this->super_QAbstractTextDocumentLayoutPrivate).document);
      pQVar13 = (QTextFrame *)CONCAT44(local_58._20_4_,local_58._16_4_);
      if (QVar30.wd <= 0.0) {
        pQVar13 = QTextDocument::rootFrame
                            ((this->super_QAbstractTextDocumentLayoutPrivate).document);
        data = QTextFrame::layoutData(pQVar13);
        if (data == (QTextFrameLayoutData *)0x0) {
          lVar14 = QMetaObject::cast((QObject *)&QTextTable::staticMetaObject);
          if (lVar14 == 0) {
            data = (QTextFrameLayoutData *)operator_new(0x78);
            data->_vptr_QTextFrameLayoutData = (_func_int **)&PTR__QTextFrameData_007dcf10;
            data[1]._vptr_QTextFrameLayoutData = (_func_int **)0x0;
            data[2]._vptr_QTextFrameLayoutData = (_func_int **)0x0;
            data[3]._vptr_QTextFrameLayoutData = (_func_int **)0x0;
            data[4]._vptr_QTextFrameLayoutData = (_func_int **)0x0;
            data[5]._vptr_QTextFrameLayoutData = (_func_int **)0x0;
            data[6]._vptr_QTextFrameLayoutData = (_func_int **)0x0;
            data[7]._vptr_QTextFrameLayoutData = (_func_int **)0x0;
            data[8]._vptr_QTextFrameLayoutData = (_func_int **)0x0;
            *(undefined4 *)&data[9]._vptr_QTextFrameLayoutData = 0x1fffffc0;
            data[10]._vptr_QTextFrameLayoutData = (_func_int **)0x0;
            *(undefined2 *)&data[0xb]._vptr_QTextFrameLayoutData = 0x101;
            data[0xc]._vptr_QTextFrameLayoutData = (_func_int **)0x0;
            data[0xd]._vptr_QTextFrameLayoutData = (_func_int **)0x0;
            data[0xe]._vptr_QTextFrameLayoutData = (_func_int **)0x0;
          }
          else {
            data = (QTextFrameLayoutData *)operator_new(0x160);
            data[1]._vptr_QTextFrameLayoutData = (_func_int **)0x0;
            data[2]._vptr_QTextFrameLayoutData = (_func_int **)0x0;
            data[3]._vptr_QTextFrameLayoutData = (_func_int **)0x0;
            data[4]._vptr_QTextFrameLayoutData = (_func_int **)0x0;
            data[5]._vptr_QTextFrameLayoutData = (_func_int **)0x0;
            data[6]._vptr_QTextFrameLayoutData = (_func_int **)0x0;
            data[7]._vptr_QTextFrameLayoutData = (_func_int **)0x0;
            data[8]._vptr_QTextFrameLayoutData = (_func_int **)0x0;
            *(undefined4 *)&data[9]._vptr_QTextFrameLayoutData = 0x1fffffc0;
            data[10]._vptr_QTextFrameLayoutData = (_func_int **)0x0;
            *(undefined2 *)&data[0xb]._vptr_QTextFrameLayoutData = 0x101;
            data[0xc]._vptr_QTextFrameLayoutData = (_func_int **)0x0;
            data[0xd]._vptr_QTextFrameLayoutData = (_func_int **)0x0;
            data[0xe]._vptr_QTextFrameLayoutData = (_func_int **)0x0;
            data[0xf]._vptr_QTextFrameLayoutData = (_func_int **)0x0;
            data->_vptr_QTextFrameLayoutData = (_func_int **)&PTR__QTextTableData_007dd0c0;
            data[0x2a]._vptr_QTextFrameLayoutData = (_func_int **)0x0;
            data[0x2b]._vptr_QTextFrameLayoutData = (_func_int **)0x0;
            memset(data + 0x11,0,0xc0);
          }
          QTextFrame::setLayoutData(pQVar13,data);
        }
        pQVar13 = (QTextFrame *)
                  ((double)(*(int *)&data[2]._vptr_QTextFrameLayoutData -
                           *(int *)((long)&data[4]._vptr_QTextFrameLayoutData + 4)) * 0.015625 -
                  (double)CONCAT44(local_58._4_4_,local_58._0_4_));
      }
    }
    local_58._16_8_ = pQVar13;
    bVar7 = QTextFormat::hasProperty((QTextFormat *)local_68,0x1060);
    if (!bVar7) {
      QBrush::QBrush(&local_108,(QBrush *)local_100);
      local_88.d.d = (Data *)local_b8._0_8_;
      local_88.d.ptr = (char16_t *)stack0xffffffffffffff50;
      local_f8.w = 0.0;
      local_f8.h = 0.0;
      local_f8.xp = 0.0;
      local_f8.yp = 0.0;
      fillBackground(painter,(QRectF *)local_58,&local_108,(QPointF *)&local_88,&local_f8);
      QBrush::~QBrush(&local_108);
    }
  }
  local_f8.xp = 0.0;
  local_f8.yp = 0.0;
  local_f8.w = 0.0;
  iVar8 = QTextBlock::position(bl);
  iVar9 = QTextBlock::length(bl);
  if ((context->selections).d.size == 0) {
    selectionFormat = (QTextCharFormat *)0x0;
  }
  else {
    lVar14 = 0;
    uVar19 = 0;
    selectionFormat = (QTextCharFormat *)0x0;
    do {
      pSVar2 = (context->selections).d.ptr;
      this_00 = (QTextCursor *)((long)&(pSVar2->cursor).d.d.ptr + lVar14);
      iVar10 = QTextCursor::selectionStart(this_00);
      iVar20 = iVar10 - iVar8;
      iVar11 = QTextCursor::selectionEnd(this_00);
      iVar18 = iVar11 - iVar8;
      if (((iVar10 < iVar11) && (iVar20 < iVar9)) && (0 < iVar18)) {
        local_58._16_4_ = -0x55555556;
        local_58._20_4_ = 0xaaaaaaaa;
        local_58._0_4_ = -0x55555556;
        local_58._4_4_ = -0x55555556;
        local_58._8_4_ = -0x55555556;
        local_58._12_4_ = -0x55555556;
        pQVar21 = (QTextFormat *)(local_58 + 8);
        QTextCharFormat::QTextCharFormat((QTextCharFormat *)pQVar21);
        local_58._4_4_ = iVar18 - iVar20;
        local_58._0_4_ = iVar20;
        QTextFormat::operator=
                  (pQVar21,(QTextFormat *)
                           ((long)&(pSVar2->format).super_QTextFormat.d.d.ptr + lVar14));
        QtPrivate::QMovableArrayOps<QTextLayout::FormatRange>::
        emplace<QTextLayout::FormatRange_const&>
                  ((QMovableArrayOps<QTextLayout::FormatRange> *)&local_f8,(qsizetype)local_f8.w,
                   (FormatRange *)local_58);
        QList<QTextLayout::FormatRange>::end((QList<QTextLayout::FormatRange> *)&local_f8);
        QTextFormat::~QTextFormat(pQVar21);
LAB_004e655f:
      }
      else {
        bVar7 = QTextCursor::hasSelection(this_00);
        if (!bVar7) {
          pQVar21 = (QTextFormat *)((long)&(pSVar2->format).super_QTextFormat.d.d.ptr + lVar14);
          bVar7 = QTextFormat::hasProperty(pQVar21,0x6000);
          if (bVar7) {
            iVar10 = QTextCursor::position(this_00);
            bVar7 = QTextBlock::contains(bl,iVar10);
            if (bVar7) {
              local_58._16_4_ = -0x55555556;
              local_58._20_4_ = 0xaaaaaaaa;
              local_58._0_4_ = -0x55555556;
              local_58._4_4_ = -0x55555556;
              local_58._8_4_ = -0x55555556;
              local_58._12_4_ = -0x55555556;
              QTextCharFormat::QTextCharFormat((QTextCharFormat *)(local_58 + 8));
              local_88.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
              local_88.d.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
              iVar10 = QTextCursor::position(this_00);
              QVar28 = QTextLayout::lineForTextPosition(this_03,iVar10 - iVar8);
              local_88.d.ptr = (char16_t *)QVar28.eng;
              local_88.d.d = (Data *)CONCAT44(local_88.d.d._4_4_,QVar28.index);
              local_58._0_4_ = QTextLine::textStart((QTextLine *)&local_88);
              local_58._4_4_ = QTextLine::textLength((QTextLine *)&local_88);
              if (local_58._0_4_ + local_58._4_4_ == iVar9 + -1) {
                local_58._4_4_ = local_58._4_4_ + 1;
              }
              QTextFormat::operator=((QTextFormat *)(local_58 + 8),pQVar21);
              QtPrivate::QMovableArrayOps<QTextLayout::FormatRange>::
              emplace<QTextLayout::FormatRange_const&>
                        ((QMovableArrayOps<QTextLayout::FormatRange> *)&local_f8,
                         (qsizetype)local_f8.w,(FormatRange *)local_58);
              QList<QTextLayout::FormatRange>::end((QList<QTextLayout::FormatRange> *)&local_f8);
              QTextFormat::~QTextFormat((QTextFormat *)(local_58 + 8));
              goto LAB_004e655f;
            }
          }
        }
      }
      pQVar22 = (QTextCharFormat *)((long)&(pSVar2->format).super_QTextFormat.d.d.ptr + lVar14);
      if (iVar18 < 1) {
        pQVar22 = selectionFormat;
      }
      if (-1 < iVar20) {
        pQVar22 = selectionFormat;
      }
      selectionFormat = pQVar22;
      uVar19 = uVar19 + 1;
      lVar14 = lVar14 + 0x18;
    } while (uVar19 < (ulong)(context->selections).d.size);
  }
  this_01 = (this->super_QAbstractTextDocumentLayoutPrivate).document;
  QTextBlock::blockFormat((QTextBlock *)local_58);
  pQVar15 = QTextDocument::objectForFormat(this_01,(QTextFormat *)local_58);
  QTextFormat::~QTextFormat((QTextFormat *)local_58);
  if (pQVar15 != (QTextObject *)0x0) {
    QTextObject::format((QTextObject *)&local_88);
    QTextFormat::toListFormat((QTextFormat *)local_58);
    iVar10 = QTextFormat::intProperty((QTextFormat *)local_58,0x3000);
    QTextFormat::~QTextFormat((QTextFormat *)local_58);
    QTextFormat::~QTextFormat((QTextFormat *)&local_88);
    if (iVar10 != 0) {
      drawListItem(this,offset,painter,context,bl,selectionFormat);
    }
  }
  local_110.d.d.ptr = (DataPtr)&DAT_aaaaaaaaaaaaaaaa;
  p = QPainter::pen(painter);
  QPen::QPen(&local_110,p);
  pQVar16 = QPalette::brush(&context->palette,Current,Text);
  QPainter::setPen(painter,&((pQVar16->d)._M_t.
                             super___uniq_ptr_impl<QBrushData,_QBrushDataPointerDeleter>._M_t.
                             super__Tuple_impl<0UL,_QBrushData_*,_QBrushDataPointerDeleter>.
                             super__Head_base<0UL,_QBrushData_*,_false>._M_head_impl)->color);
  if (((context->clip).w <= 0.0) || ((context->clip).h <= 0.0)) {
    qVar4 = (this->clipRect).xp;
    qVar5 = (this->clipRect).yp;
    local_58._16_8_ = (this->clipRect).w;
    pcStack_40 = (char *)(this->clipRect).h;
    local_58._0_4_ = SUB84(qVar4,0);
    local_58._4_4_ = (undefined4)((ulong)qVar4 >> 0x20);
    local_58._8_4_ = SUB84(qVar5,0);
    local_58._12_4_ = (undefined4)((ulong)qVar5 >> 0x20);
  }
  else {
    QRectF::operator&((QRectF *)local_58,&context->clip);
  }
  QTextLayout::draw(this_03,painter,offset,(QList<QTextLayout::FormatRange> *)&local_f8,
                    (QRectF *)local_58);
  frameIteratorForTextPosition((Iterator *)local_58,this,iVar8);
  bVar7 = isEmptyBlockBeforeTable((Iterator *)local_58);
  if (!bVar7) {
    iVar10 = context->cursorPosition;
    if (iVar10 < iVar8 || iVar9 + iVar8 <= iVar10) {
      if (iVar10 < -1) {
        QTextLayout::preeditAreaText(&local_88,this_03);
        if ((QTextFormatPrivate *)local_88.d.d != (QTextFormatPrivate *)0x0) {
          LOCK();
          *(int *)local_88.d.d = *(int *)local_88.d.d + -1;
          UNLOCK();
          if (*(int *)local_88.d.d == 0) {
            QArrayData::deallocate(&(local_88.d.d)->super_QArrayData,2,0x10);
          }
        }
        if (local_88.d.size != 0) {
          iVar10 = context->cursorPosition;
          goto LAB_004e68e5;
        }
      }
    }
    else {
LAB_004e68e5:
      if (iVar10 < -1) {
        iVar8 = QTextLayout::preeditAreaPosition(this_03);
        iVar10 = (iVar8 - iVar10) + -2;
      }
      else {
        iVar10 = iVar10 - iVar8;
      }
      QTextLayout::drawCursor(this_03,painter,offset,iVar10,this->cursorWidth);
    }
  }
  bVar7 = QTextFormat::hasProperty((QTextFormat *)local_68,0x1060);
  if (bVar7) {
    QVar31 = QTextFormat::lengthProperty((QTextFormat *)local_68,0x1060);
    TVar12 = QVar31.lengthType;
    dVar23 = (double)CONCAT44(uStack_a4,local_a8);
    if (TVar12 != VariableLength) {
      dVar23 = QVar31.fixedValueOrPercentage;
      if (TVar12 == PercentageLength) {
        dVar23 = (dVar23 * (double)CONCAT44(uStack_a4,local_a8)) / 100.0;
      }
      else if (TVar12 != FixedLength) {
        dVar23 = -1.0;
      }
    }
    local_88.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    local_88.d.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
    bVar7 = QTextFormat::hasProperty((QTextFormat *)local_68,0x820);
    if (bVar7) {
      __return_storage_ptr__ = (QVariant *)local_58;
      QTextFormat::property(__return_storage_ptr__,(QTextFormat *)local_68,0x820);
      local_90.d_ptr = &QtPrivate::QMetaTypeInterfaceWrapper<QBrush>::metaType;
      local_98._M_head_impl = (QBrushData *)((ulong)pcStack_40 & 0xfffffffffffffffc);
      bVar7 = comparesEqual((QMetaType *)&local_98,&local_90);
      if (bVar7) {
        if (((ulong)pcStack_40 & 1) == 0) {
          pQVar16 = (QBrush *)local_58;
        }
        else {
          pQVar16 = (QBrush *)
                    ((long)*(int *)(CONCAT44(local_58._4_4_,local_58._0_4_) + 4) +
                    CONCAT44(local_58._4_4_,local_58._0_4_));
        }
        QBrush::QBrush((QBrush *)&local_98,pQVar16);
      }
      else {
        local_98._M_head_impl = (QBrushData *)&DAT_aaaaaaaaaaaaaaaa;
        QBrush::QBrush((QBrush *)&local_98);
        QVar17.d_ptr = (QMetaTypeInterface *)::QVariant::metaType();
        if (((ulong)pcStack_40 & 1) != 0) {
          __return_storage_ptr__ =
               (QVariant *)
               ((long)*(int *)(CONCAT44(local_58._4_4_,local_58._0_4_) + 4) +
               CONCAT44(local_58._4_4_,local_58._0_4_));
        }
        QMetaType::convert(QVar17,__return_storage_ptr__,local_90,&local_98);
      }
      local_88.d.d = *(Data **)&(local_98._M_head_impl)->color;
      local_88.d.ptr = *(char16_t **)((long)&((local_98._M_head_impl)->color).ct + 4);
      QBrush::~QBrush((QBrush *)&local_98);
      ::QVariant::~QVariant((QVariant *)local_58);
    }
    else {
      pQVar16 = QPalette::brush(&context->palette,Inactive,WindowText);
      _Var3._M_head_impl =
           (pQVar16->d)._M_t.super___uniq_ptr_impl<QBrushData,_QBrushDataPointerDeleter>._M_t.
           super__Tuple_impl<0UL,_QBrushData_*,_QBrushDataPointerDeleter>.
           super__Head_base<0UL,_QBrushData_*,_false>._M_head_impl;
      local_88.d.d = *(Data **)&(_Var3._M_head_impl)->color;
      local_88.d.ptr = *(char16_t **)((long)&(_Var3._M_head_impl)->color + 8);
    }
    QPainter::setPen(painter,(QColor *)&local_88);
    pcVar24 = (char *)((double)stack0xffffffffffffff50 + (double)CONCAT44(uStack_9c,uStack_a0));
    iVar8 = QTextBlock::length(bl);
    if (iVar8 == 1) {
      pcVar24 = (char *)((double)CONCAT44(uStack_9c,uStack_a0) * 0.5 +
                        (double)stack0xffffffffffffff50);
    }
    dVar1 = (double)CONCAT44(uStack_a4,local_a8) * 0.5 + (double)local_b8._0_8_;
    local_58._0_8_ = dVar1 - dVar23 * 0.5;
    local_58._16_8_ = dVar1 + dVar23 * 0.5;
    local_58._8_4_ = SUB84(pcVar24,0);
    local_58._12_4_ = (undefined4)((ulong)pcVar24 >> 0x20);
    pcStack_40 = pcVar24;
    QPainter::drawLines(painter,(QLineF *)local_58,1);
  }
  QPainter::setPen(painter,&local_110);
  QPen::~QPen(&local_110);
  QArrayDataPointer<QTextLayout::FormatRange>::~QArrayDataPointer
            ((QArrayDataPointer<QTextLayout::FormatRange> *)&local_f8);
  QBrush::~QBrush((QBrush *)local_100);
  QTextFormat::~QTextFormat((QTextFormat *)local_68);
LAB_004e6bbf:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QTextDocumentLayoutPrivate::drawBlock(const QPointF &offset, QPainter *painter,
                                           const QAbstractTextDocumentLayout::PaintContext &context,
                                           const QTextBlock &bl, bool inRootFrame) const
{
    const QTextLayout *tl = bl.layout();
    QRectF r = tl->boundingRect();
    r.translate(offset + tl->position());
    if (!bl.isVisible() || (context.clip.isValid() && (r.bottom() < context.clip.y() || r.top() > context.clip.bottom())))
        return;
    qCDebug(lcDraw) << "drawBlock" << bl.position() << "at" << offset << "br" << tl->boundingRect();

    QTextBlockFormat blockFormat = bl.blockFormat();

    QBrush bg = blockFormat.background();
    if (bg != Qt::NoBrush) {
        QRectF rect = r;

        // extend the background rectangle if we're in the root frame with NoWrap,
        // as the rect of the text block will then be only the width of the text
        // instead of the full page width
        if (inRootFrame && document->pageSize().width() <= 0) {
            const QTextFrameData *fd = data(document->rootFrame());
            rect.setRight((fd->size.width - fd->rightMargin).toReal());
        }

        // in the case of <hr>, the background-color CSS style fills only the rule's thickness instead of the whole line
        if (!blockFormat.hasProperty(QTextFormat::BlockTrailingHorizontalRulerWidth))
            fillBackground(painter, rect, bg, r.topLeft());
    }

    QList<QTextLayout::FormatRange> selections;
    int blpos = bl.position();
    int bllen = bl.length();
    const QTextCharFormat *selFormat = nullptr;
    for (int i = 0; i < context.selections.size(); ++i) {
        const QAbstractTextDocumentLayout::Selection &range = context.selections.at(i);
        const int selStart = range.cursor.selectionStart() - blpos;
        const int selEnd = range.cursor.selectionEnd() - blpos;
        if (selStart < bllen && selEnd > 0
             && selEnd > selStart) {
            QTextLayout::FormatRange o;
            o.start = selStart;
            o.length = selEnd - selStart;
            o.format = range.format;
            selections.append(o);
        } else if (! range.cursor.hasSelection() && range.format.hasProperty(QTextFormat::FullWidthSelection)
                   && bl.contains(range.cursor.position())) {
            // for full width selections we don't require an actual selection, just
            // a position to specify the line. that's more convenience in usage.
            QTextLayout::FormatRange o;
            QTextLine l = tl->lineForTextPosition(range.cursor.position() - blpos);
            o.start = l.textStart();
            o.length = l.textLength();
            if (o.start + o.length == bllen - 1)
                ++o.length; // include newline
            o.format = range.format;
            selections.append(o);
       }
        if (selStart < 0 && selEnd >= 1)
            selFormat = &range.format;
    }

    QTextObject *object = document->objectForFormat(bl.blockFormat());
    if (object && object->format().toListFormat().style() != QTextListFormat::ListStyleUndefined)
        drawListItem(offset, painter, context, bl, selFormat);

    QPen oldPen = painter->pen();
    painter->setPen(context.palette.color(QPalette::Text));

    tl->draw(painter, offset, selections, context.clip.isValid() ? (context.clip & clipRect) : clipRect);

    // if the block is empty and it precedes a table, do not draw the cursor.
    // the cursor is drawn later after the table has been drawn so no need
    // to draw it here.
    if (!isEmptyBlockBeforeTable(frameIteratorForTextPosition(blpos))
        && ((context.cursorPosition >= blpos && context.cursorPosition < blpos + bllen)
            || (context.cursorPosition < -1 && !tl->preeditAreaText().isEmpty()))) {
        int cpos = context.cursorPosition;
        if (cpos < -1)
            cpos = tl->preeditAreaPosition() - (cpos + 2);
        else
            cpos -= blpos;
        tl->drawCursor(painter, offset, cpos, cursorWidth);
    }

    if (blockFormat.hasProperty(QTextFormat::BlockTrailingHorizontalRulerWidth)) {
        const qreal width = blockFormat.lengthProperty(QTextFormat::BlockTrailingHorizontalRulerWidth).value(r.width());
        const auto color = blockFormat.hasProperty(QTextFormat::BackgroundBrush)
                         ? qvariant_cast<QBrush>(blockFormat.property(QTextFormat::BackgroundBrush)).color()
                         : context.palette.color(QPalette::Inactive, QPalette::WindowText);
        painter->setPen(color);
        qreal y = r.bottom();
        if (bl.length() == 1)
            y = r.top() + r.height() / 2;

        const qreal middleX = r.left() + r.width() / 2;
        painter->drawLine(QLineF(middleX - width / 2, y, middleX + width / 2, y));
    }

    painter->setPen(oldPen);
}